

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QSize __thiscall QMenu::sizeHint(QMenu *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QMenuPrivate *pQVar5;
  qsizetype qVar6;
  QStyle *pQVar7;
  int *piVar8;
  QSize QVar9;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int fw;
  QRect *rect;
  int i;
  QMenuPrivate *d;
  QSize s;
  QStyleOption opt;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QWidget *widget;
  QStyleOption *in_stack_ffffffffffffff58;
  int local_6c;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QWidgetData *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QMenu *)0x647370);
  QMenuPrivate::updateActionRects
            ((QMenuPrivate *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  for (local_6c = 0; qVar6 = QList<QRect>::size(&pQVar5->actionRects), local_6c < qVar6;
      local_6c = local_6c + 1) {
    QList<QRect>::at((QList<QRect> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (!bVar1) {
      iVar2 = QRect::bottom((QRect *)0x647412);
      iVar3 = QSize::height((QSize *)0x647420);
      if (iVar3 <= iVar2) {
        QRect::y((QRect *)0x647434);
        QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      }
      iVar2 = QRect::right((QRect *)0x64745c);
      iVar3 = QSize::width((QSize *)0x64746a);
      if (iVar3 <= iVar2) {
        QRect::x((QRect *)0x64747e);
        QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff3c);
      }
    }
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  widget = (QWidget *)&local_48;
  QStyleOption::QStyleOption(in_stack_ffffffffffffff58,(int)((ulong)widget >> 0x20),(int)widget);
  QStyleOption::initFrom(in_stack_ffffffffffffff58,widget);
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1e,widget,in_RDI);
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1c,widget,in_RDI);
  iVar3 = iVar3 + iVar2 + (int)(pQVar5->super_QWidgetPrivate).rightmargin;
  piVar8 = QSize::rwidth((QSize *)0x647575);
  *piVar8 = *piVar8 + iVar3;
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1d,widget,in_RDI);
  iVar2 = iVar4 + iVar2 + (int)(pQVar5->super_QWidgetPrivate).bottommargin;
  piVar8 = QSize::rheight((QSize *)0x6475c9);
  *piVar8 = *piVar8 + iVar2;
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QVar9 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,10,widget,&local_50,in_RDI);
  QStyleOption::~QStyleOption((QStyleOption *)CONCAT44(iVar2,iVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar9;
}

Assistant:

QSize QMenu::sizeHint() const
{
    Q_D(const QMenu);
    d->updateActionRects();

    QSize s;
    for (int i = 0; i < d->actionRects.size(); ++i) {
        const QRect &rect = d->actionRects.at(i);
        if (rect.isNull())
            continue;
        if (rect.bottom() >= s.height())
            s.setHeight(rect.y() + rect.height());
        if (rect.right() >= s.width())
            s.setWidth(rect.x() + rect.width());
    }
    // Note that the action rects calculated above already include
    // the top and left margins, so we only need to add margins for
    // the bottom and right.
    QStyleOption opt(0);
    opt.initFrom(this);
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, this);
    s.rwidth() += style()->pixelMetric(QStyle::PM_MenuHMargin, &opt, this) + fw + d->rightmargin;
    s.rheight() += style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, this) + fw + d->bottommargin;

    return style()->sizeFromContents(QStyle::CT_Menu, &opt, s, this);
}